

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.cpp
# Opt level: O3

void __thiscall backend::Backend::show_passes(Backend *this,ostream *o)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ostream *poVar4;
  unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *pass;
  pointer puVar5;
  pointer puVar6;
  string local_50;
  
  puVar5 = (this->mir_passes).
           super__Vector_base<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->mir_passes).
           super__Vector_base<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      (**((puVar5->_M_t).
          super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
         _vptr_MirOptimizePass)(&local_50);
      bVar3 = should_run_pass(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(o," Run: ",6);
        (**((puVar5->_M_t).
            super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
            ._M_t.
            super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
            .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
           _vptr_MirOptimizePass)(&local_50);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (o,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"Skip: ",6);
        (**((puVar5->_M_t).
            super___uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
            ._M_t.
            super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
            .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl)->
           _vptr_MirOptimizePass)(&local_50);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (o,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o," Run: mir_to_arm",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
  std::ostream::put((char)o);
  std::ostream::flush();
  puVar6 = (this->arm_passes).
           super__Vector_base<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->arm_passes).
           super__Vector_base<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    do {
      (**((puVar6->_M_t).
          super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
          ._M_t.
          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
         _vptr_ArmOptimizePass)(&local_50);
      bVar3 = should_run_pass(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(o," Run: ",6);
        (**((puVar6->_M_t).
            super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
            ._M_t.
            super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
            .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
           _vptr_ArmOptimizePass)(&local_50);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (o,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"Skip: ",6);
        (**((puVar6->_M_t).
            super___uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
            ._M_t.
            super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
            .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl)->
           _vptr_ArmOptimizePass)(&local_50);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (o,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  return;
}

Assistant:

void Backend::show_passes(std::ostream& o) {
  for (auto& pass : mir_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
  o << " Run: mir_to_arm" << std::endl;
  for (auto& pass : arm_passes) {
    if (!should_run_pass(pass->pass_name())) {
      o << "Skip: " << pass->pass_name() << std::endl;
    } else {
      o << " Run: " << pass->pass_name() << std::endl;
    }
  }
}